

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O2

bool __thiscall
ON_SN_BLOCK::IsValidBlock
          (ON_SN_BLOCK *this,ON_TextLog *textlog,SN_ELEMENT ***hash_table,
          ON__UINT32 hash_block_count,ON__UINT64 *active_id_count)

{
  ON_UUID *id;
  uint uVar1;
  uint uVar2;
  long lVar3;
  ON_UUID *pOVar4;
  bool bVar5;
  ON__UINT32 OVar6;
  ulong uVar7;
  ulong uVar8;
  ON_UUID *pOVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  ON__UINT64 *p;
  long lVar13;
  
  uVar1 = this->m_count;
  uVar12 = (ulong)uVar1;
  if (uVar1 < 0x2001) {
    uVar2 = this->m_purged;
    uVar7 = (ulong)uVar2;
    if (uVar2 <= uVar1) {
      if ((uVar1 < 2) && (this->m_sorted != 1)) {
        if (textlog != (ON_TextLog *)0x0) {
          ON_TextLog::Print(textlog,"ON_SN_BLOCK m_count = %u but m_sorted is not 1.\n",uVar12);
        }
      }
      else {
        if (uVar1 == 0) {
          if (this->m_sn0 == 0) {
            if (this->m_sn1 == 0) {
              return true;
            }
            if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
            pcVar11 = "ON_SN_BLOCK m_count = 0 but m_sn1 != 0.\n";
          }
          else {
            if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
            pcVar11 = "ON_SN_BLOCK m_count = 0 but m_sn0 != 0.\n";
          }
        }
        else {
          if ((this->m_sn0 <= this->m_sn1) &&
             ((uVar1 <= uVar2 || ((ulong)(~uVar2 + uVar1) <= this->m_sn1 - this->m_sn0)))) {
            uVar7 = 0;
            uVar10 = 0;
            uVar8 = 0;
            lVar13 = 0;
LAB_004e9991:
            if (uVar12 <= uVar10) goto LAB_004e9ab8;
            id = &this->m_sn[uVar10].m_id;
            if (this->m_sn[uVar10].m_sn_active != '\0') {
              if (id[1].Data4[1] == '\0') goto LAB_004e9a57;
              lVar3._0_4_ = id->Data1;
              lVar3._4_2_ = id->Data2;
              lVar3._6_2_ = id->Data3;
              if ((lVar3 == 0) && (*(long *)id->Data4 == 0)) {
                if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
                pcVar11 = "ON_SN_BLOCK m_sn[%d].m_id_active != 0 but m_id = 0.\n";
              }
              else {
                OVar6 = IdCRC32(id);
                if (OVar6 == *(ON__UINT32 *)(id[1].Data4 + 4)) {
                  lVar13 = lVar13 + 1;
                  if (hash_table != (SN_ELEMENT ***)0x0) {
                    pOVar9 = (ON_UUID *)
                             ((ulong)(uint)((int)(((ulong)OVar6 / 0xffa) % 0xffa) << 3) +
                             (long)hash_table[(ulong)OVar6 % (ulong)hash_block_count]);
                    do {
                      pOVar4 = *(ON_UUID **)pOVar9;
                      if (pOVar4 == (ON_UUID *)0x0) break;
                      pOVar9 = pOVar4 + 2;
                    } while (pOVar4 != id);
                    if (pOVar4 != (ON_UUID *)0x0) goto LAB_004e9a57;
                    if (textlog != (ON_TextLog *)0x0) {
                      pcVar11 = 
                      "ON_SN_BLOCK m_sn[%d].m_id_active != 0 but the element is not in m_hash_table[].\n"
                      ;
                      goto LAB_004e9b96;
                    }
                    goto LAB_004e98eb;
                  }
                  goto LAB_004e9a57;
                }
                if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
                pcVar11 = 
                "ON_SN_BLOCK m_sn[%d].m_id_active != 0 and m_sn[i].m_id_crc32 != IdCRC32(&m_sn[i].m_id).\n"
                ;
              }
LAB_004e9b96:
              ON_TextLog::Print(textlog,pcVar11,uVar10);
              goto LAB_004e98eb;
            }
            if (id[1].Data4[1] != '\0') {
              if (textlog != (ON_TextLog *)0x0) {
                pcVar11 = "ON_SN_BLOCK m_sn[%d].m_sn_active = 0 but m_id_active != 0.\n";
                goto LAB_004e9b96;
              }
              goto LAB_004e98eb;
            }
            uVar8 = uVar8 + 1;
LAB_004e9a57:
            uVar12._0_4_ = id[1].Data1;
            uVar12._4_2_ = id[1].Data2;
            uVar12._6_2_ = id[1].Data3;
            if (uVar12 < this->m_sn0) {
              if (textlog != (ON_TextLog *)0x0) {
                pcVar11 = "ON_SN_BLOCK m_sn[%d] < m_sn0.\n";
                goto LAB_004e9b96;
              }
              goto LAB_004e98eb;
            }
            if (this->m_sn1 < uVar12) {
              if (textlog != (ON_TextLog *)0x0) {
                pcVar11 = "ON_SN_BLOCK m_sn[%d] > m_sn1.\n";
                goto LAB_004e9b96;
              }
              goto LAB_004e98eb;
            }
            if ((this->m_sorted != 0) && (bVar5 = uVar12 <= uVar7, uVar7 = uVar12, bVar5)) {
              if (textlog != (ON_TextLog *)0x0) {
                ON_TextLog::Print(textlog,"ON_SN_BLOCK m_sn[%d] > m_sn[%d].\n",uVar10,uVar10 - 1);
              }
              goto LAB_004e98eb;
            }
            uVar10 = uVar10 + 1;
            uVar12 = (ulong)this->m_count;
            goto LAB_004e9991;
          }
          if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
          pcVar11 = "ON_SN_BLOCK m_sn1 < m_sn0.\n";
        }
        ON_TextLog::Print(textlog,pcVar11);
      }
      goto LAB_004e98eb;
    }
    if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
    pcVar11 = "ON_SN_BLOCK m_purged = %u (should be >0 and <=%u).\n";
    uVar8 = (ulong)uVar1;
  }
  else {
    if (textlog == (ON_TextLog *)0x0) goto LAB_004e98eb;
    pcVar11 = "ON_SN_BLOCK m_count = %u (should be >=0 and <%u).\n";
    uVar8 = 0x2000;
    uVar7 = uVar12;
  }
  ON_TextLog::Print(textlog,pcVar11,uVar7,uVar8);
LAB_004e98eb:
  bVar5 = ON_IsNotValid();
  return bVar5;
LAB_004e9ab8:
  if (uVar8 == this->m_purged) {
    if (active_id_count != (ON__UINT64 *)0x0) {
      *active_id_count = *active_id_count + lVar13;
    }
    return true;
  }
  if (textlog != (ON_TextLog *)0x0) {
    ON_TextLog::Print(textlog,"ON_SN_BLOCK m_purged = %u (should be %u)\n");
  }
  goto LAB_004e98eb;
}

Assistant:

bool ON_SN_BLOCK::IsValidBlock(
  ON_TextLog* textlog, 
  struct ON_SerialNumberMap::SN_ELEMENT*const*const* hash_table,
  ON__UINT32 hash_block_count,
  ON__UINT64* active_id_count
  ) const
{
  ON__UINT64 sn0, sn;
  size_t i, pc, aidcnt;

  if ( m_count > ON_SN_BLOCK::SN_BLOCK_CAPACITY )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_count = %u (should be >=0 and <%u).\n",
                      m_count,ON_SN_BLOCK::SN_BLOCK_CAPACITY);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_purged > m_count )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_purged = %u (should be >0 and <=%u).\n",
                      m_purged,m_count);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_count < 2 && 1 != m_sorted )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_count = %u but m_sorted is not 1.\n",m_count);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( 0 == m_count )
  {
    if ( 0 != m_sn0 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_count = 0 but m_sn0 != 0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    if ( 0 != m_sn1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_count = 0 but m_sn1 != 0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    return true;
  }

  if ( m_sn1 < m_sn0 )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_sn1 < m_sn0.\n");
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  if ( m_count > m_purged )
  {
    if ( m_sn1 - m_sn0 < m_count-m_purged-1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn1 < m_sn0.\n");
      return ON_SerialNumberMap_IsNotValidBlock();
    }
  }

  sn0 = 0;
  pc = 0;
  aidcnt = 0;
  for (i = 0; i < m_count; i++)
  {
    // validate m_sn_active and m_id_active flags
    if (0 == m_sn[i].m_sn_active)
    {
      // The element serial number is not active.
      // The id must also be not active.
      pc++;
      if ( 0 != m_sn[i].m_id_active )
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d].m_sn_active = 0 but m_id_active != 0.\n",i);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
    }
    else if ( 0 != m_sn[i].m_id_active )
    {
      // The element has active serial number and active id.
      // It must have a nonzero m_id and be in the hash table.
      aidcnt++;
      if ( IdIsNotNil(&m_sn[i].m_id) )
      {
        const ON__UINT32 id_crc32 = IdCRC32(&m_sn[i].m_id);
        if (id_crc32 != m_sn[i].m_id_crc32)
        {
          if (textlog)
            textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 and m_sn[i].m_id_crc32 != IdCRC32(&m_sn[i].m_id).\n", i);
          return ON_SerialNumberMap_IsNotValidBlock();
        }
        if (nullptr != hash_table)
        {
          const ON_SerialNumberMap::SN_ELEMENT* e = nullptr;
          for (e = hash_table[id_crc32 % hash_block_count][(id_crc32/ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY) % ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY]; 0 != e; e = e->m_next)
          {
            if (e == &m_sn[i])
            {
              // found m_sn[i] in the hash table
              break;
            }
          }
          if (nullptr == e)
          {
            // m_sn[i] is not in the hash table but m_id_active indicates
            // it should be.
            if (textlog)
              textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 but the element is not in m_hash_table[].\n", i);
            return ON_SerialNumberMap_IsNotValidBlock();
          }
        }
      }
      else 
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d].m_id_active != 0 but m_id = 0.\n",i);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
    }

    // verify the serial number is in the range m_sn0 to m_sn1
    sn = m_sn[i].m_sn;
    if ( sn < m_sn0 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn[%d] < m_sn0.\n",i);
      return ON_SerialNumberMap_IsNotValidBlock();
    }
    if ( sn > m_sn1 )
    {
      if (textlog)
        textlog->Print("ON_SN_BLOCK m_sn[%d] > m_sn1.\n",i);
      return ON_SerialNumberMap_IsNotValidBlock();
    }

    if ( m_sorted )
    {
      // Verify this sn is bigger than the previous one
      if (sn <= sn0 )
      {
        if (textlog)
          textlog->Print("ON_SN_BLOCK m_sn[%d] > m_sn[%d].\n",i,i-1);
        return ON_SerialNumberMap_IsNotValidBlock();
      }
      sn0 = sn;
    }
  }

  if ( pc != m_purged )
  {
    if (textlog)
      textlog->Print("ON_SN_BLOCK m_purged = %u (should be %u)\n",m_purged,pc);
    return ON_SerialNumberMap_IsNotValidBlock();
  }

  // Update the active id count to include
  // the active ids from this block.
  if ( 0 != active_id_count )
    *active_id_count += aidcnt;

  return true;
}